

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_states.cpp
# Opt level: O2

void __thiscall
SMC::sample_distance
          (SMC *this,Atom *b,Atom *c,Atom *B,double theta,double lcd,Atom *p,double lcon,int label,
          int rem)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  int iVar17;
  long lVar18;
  Atom *A;
  undefined4 uVar19;
  undefined4 uVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dStack_470;
  double dStack_460;
  double local_448;
  undefined8 uStack_440;
  Point local_398;
  Point local_378;
  Atom *local_360;
  double local_358;
  double dStack_350;
  double local_348;
  double dStack_340;
  Point local_338;
  Atom p2;
  Atom p1;
  undefined1 local_278 [16];
  double local_268;
  Point local_258;
  double pdf [32];
  double cdf [32];
  
  local_360 = p;
  dVar28 = Point::dis(&b->super_Point,&c->super_Point);
  dVar21 = (c->super_Point).z;
  dVar23 = (b->super_Point).z;
  dVar29 = (c->super_Point).x - (b->super_Point).x;
  dVar22 = (c->super_Point).y - (b->super_Point).y;
  auVar2._8_4_ = SUB84(dVar22,0);
  auVar2._0_8_ = dVar29;
  auVar2._12_4_ = (int)((ulong)dVar22 >> 0x20);
  dVar22 = cos(theta);
  dVar28 = (dVar22 * lcd) / dVar28;
  dStack_460 = auVar2._8_8_;
  dVar3 = (c->super_Point).x;
  dVar4 = (c->super_Point).y;
  dVar25 = dVar3 - dVar28 * dVar29;
  dVar26 = dVar4 - dVar28 * dStack_460;
  dVar22 = (c->super_Point).z;
  local_378.z = dVar22 - (dVar21 - dVar23) * dVar28;
  local_398.z = (B->super_Point).z;
  dVar3 = dVar3 - (b->super_Point).x;
  dVar4 = dVar4 - (b->super_Point).y;
  dVar28 = (B->super_Point).x;
  dVar29 = (B->super_Point).y;
  dVar22 = dVar22 - (b->super_Point).z;
  dVar21 = ((local_398.z - local_378.z) * dVar22 +
           (dVar28 - dVar25) * dVar3 + (dVar29 - dVar26) * dVar4) /
           (dVar22 * dVar22 + dVar3 * dVar3 + dVar4 * dVar4);
  dVar28 = dVar28 - dVar21 * dVar3;
  dVar29 = dVar29 - dVar21 * dVar4;
  local_398.z = local_398.z - dVar22 * dVar21;
  dVar22 = local_398.z - local_378.z;
  local_398.x = dVar28;
  local_398.y = dVar29;
  local_378.x = dVar25;
  local_378.y = dVar26;
  dVar21 = sin(theta);
  dVar23 = Point::dis(&local_398,&local_378);
  dVar23 = (dVar21 * lcd) / dVar23;
  local_258.z = dVar22 * dVar23 + local_378.z;
  local_258.x = dVar23 * (dVar28 - dVar25) + local_378.x;
  local_258.y = dVar23 * (dVar29 - dVar26) + local_378.y;
  dVar28 = local_398.z - local_378.z;
  dVar21 = local_398.x - local_378.x;
  auVar1._8_4_ = SUB84(local_398.y - local_378.y,0);
  auVar1._0_8_ = dVar21;
  auVar1._12_4_ = (int)((ulong)(local_398.y - local_378.y) >> 0x20);
  dVar23 = sin(theta);
  dVar22 = Point::dis(&local_398,&local_378);
  dVar22 = (dVar23 * lcd) / dVar22;
  dStack_470 = auVar1._8_8_;
  dVar23 = local_378.y - dVar22 * dStack_470;
  local_268 = local_378.z - dVar28 * dVar22;
  local_278._8_4_ = SUB84(dVar23,0);
  local_278._0_8_ = local_378.x - dVar22 * dVar21;
  local_278._12_4_ = (int)((ulong)dVar23 >> 0x20);
  dVar28 = Point::dis((Point *)local_278,&B->super_Point);
  dVar29 = Point::dis(&local_258,&B->super_Point);
  Atom::Atom(&p1,0.0,0.0,0.0,-0x3039);
  Atom::Atom(&p2,0.0,0.0,0.0,-0x3039);
  dVar28 = lcon - dVar28;
  dVar29 = lcon - dVar29;
  lVar11 = (long)rem;
  dVar3 = lcon - this->minDistcon[label][lVar11];
  dVar21 = this->minDistdel[label][lVar11];
  dVar23 = this->DistconBy[label][lVar11];
  dVar4 = dVar3 / dVar23 + 1e-05;
  iVar17 = (int)dVar4;
  dVar22 = this->DistdelBy[label][lVar11];
  dVar25 = (double)(int)dVar4 * dVar23;
  dVar4 = dVar23 + dVar25;
  dVar26 = dVar28 - dVar21;
  iVar15 = (int)((1.0 / dVar22) * (dVar29 - dVar21));
  if (dVar26 <= 0.0) {
    pdf[0] = (1.0 / dVar23) *
             ((dVar4 - dVar3) * this->etedCon[label][lVar11][iVar17][0] +
             (dVar3 - dVar25) * this->etedCon[label][lVar11][(long)iVar17 + 1][0]);
    dVar26 = 0.0;
    iVar14 = 0;
  }
  else {
    dVar30 = (1.0 / dVar22) * dVar26;
    iVar14 = (int)dVar30;
    dVar31 = ((double)(iVar14 + 1) * dVar22 - dVar28) + dVar21;
    dVar26 = dVar26 - (double)(int)dVar30 * dVar22;
    pdf[iVar14] = ((dVar3 - dVar25) *
                   this->etedCon[label][lVar11][(long)iVar17 + 1][(long)iVar14 + 1] * dVar26 +
                  (dVar4 - dVar3) * this->etedCon[label][lVar11][iVar17][(long)iVar14 + 1] * dVar26
                  + dVar31 * this->etedCon[label][lVar11][iVar17][iVar14] * (dVar4 - dVar3) +
                    this->etedCon[label][lVar11][(long)iVar17 + 1][iVar14] * (dVar3 - dVar25) *
                    dVar31) / (dVar23 * dVar22);
    dVar26 = dVar22 - dVar26;
  }
  if (iVar15 < 0x1f) {
    iVar12 = iVar15 + 1;
    dVar31 = ((double)iVar12 * dVar22 - dVar29) + dVar21;
    dVar30 = (dVar29 - dVar21) - (double)iVar15 * dVar22;
    pdf[iVar12] = (this->etedCon[label][lVar11][(long)iVar17 + 1][iVar12] * (dVar3 - dVar25) *
                   dVar30 + this->etedCon[label][lVar11][iVar17][iVar12] * (dVar4 - dVar3) * dVar30
                            + dVar31 * this->etedCon[label][lVar11][iVar17][iVar15] *
                                       (dVar4 - dVar3) +
                              this->etedCon[label][lVar11][(long)iVar17 + 1][iVar15] *
                              (dVar3 - dVar25) * dVar31) / (dVar23 * dVar22);
    dVar29 = dVar22 - (((double)iVar12 * dVar22 + dVar21) - dVar29);
  }
  else {
    pdf[0x1f] = (this->etedCon[label][lVar11][iVar17][0x1f] * (dVar4 - dVar3) +
                this->etedCon[label][lVar11][(long)iVar17 + 1][0x1f] * (dVar3 - dVar25)) *
                (1.0 / dVar23);
    dVar29 = 0.0;
    iVar12 = 0x1f;
  }
  dVar30 = (this->etedCon[label][lVar11][iVar17][(long)iVar14 + 1] * (dVar4 - dVar3) +
           this->etedCon[label][lVar11][(long)iVar17 + 1][(long)iVar14 + 1] * (dVar3 - dVar25)) *
           (1.0 / dVar23);
  pdf[(long)iVar14 + 1] = dVar30;
  cdf[iVar14] = 0.0;
  dVar30 = (dVar30 + pdf[iVar14]) * 0.5 * dVar26;
  cdf[(long)iVar14 + 1] = dVar30;
  lVar18 = (long)(iVar14 + 2);
  lVar13 = (long)iVar12;
  for (lVar16 = 0; lVar18 + lVar16 < lVar13; lVar16 = lVar16 + 1) {
    dVar30 = (this->etedCon[label][lVar11][iVar17][lVar18 + lVar16] * (dVar4 - dVar3) +
             this->etedCon[label][lVar11][(long)iVar17 + 1][lVar18 + lVar16] * (dVar3 - dVar25)) *
             (1.0 / dVar23);
    pdf[lVar18 + lVar16] = dVar30;
    dVar30 = (dVar30 + pdf[lVar18 + lVar16 + -1]) * 0.5 * dVar22 + pdf[lVar18 + lVar16 + 0x1f];
    cdf[lVar18 + lVar16] = dVar30;
  }
  dVar23 = pdf[lVar13 + 0x1f];
  dVar3 = (pdf[lVar13] + pdf[lVar13 + -1]) * 0.5 * dVar29 + dVar23;
  cdf[lVar13] = dVar3;
  iVar15 = rand();
  dVar31 = local_378.z;
  dVar25 = local_378.y;
  dVar4 = local_378.x;
  dVar24 = (((double)iVar15 + 0.5) / 2147483647.0) * dVar3 + 0.0;
  if (dVar24 <= cdf[(long)iVar14 + 1]) {
    dVar30 = dVar28 + (dVar26 * dVar24) / cdf[(long)iVar14 + 1];
  }
  else {
    lVar11 = (lVar18 << 0x20) + -0x100000000;
    for (; lVar18 < lVar13; lVar18 = lVar18 + 1) {
      if (dVar24 <= cdf[lVar18]) {
        dVar28 = *(double *)((long)cdf + (lVar11 >> 0x1d));
        dVar30 = ((dVar24 - dVar28) * dVar22) / (cdf[lVar18] - dVar28) +
                 (((double)(int)lVar18 * dVar22 + dVar21) - dVar22);
        break;
      }
      lVar11 = lVar11 + 0x100000000;
    }
    if ((dVar24 <= dVar3) && (dVar23 <= dVar24)) {
      dVar30 = (dVar29 * (dVar24 - dVar23)) / (dVar3 - dVar23) +
               dVar22 * (double)(iVar12 + -1) + dVar21;
    }
  }
  dVar21 = (B->super_Point).x;
  dVar23 = (B->super_Point).y;
  dVar22 = (B->super_Point).z;
  dVar28 = sin(theta);
  dVar29 = sin(theta);
  dVar3 = Point::dis(&local_398,&local_378);
  dVar22 = dVar22 - dVar31;
  dVar21 = dVar21 - dVar4;
  dVar23 = dVar23 - dVar25;
  dVar4 = sin(theta);
  dVar22 = acos(((lcd * lcd * dVar28 * dVar29 + dVar22 * dVar22 + dVar21 * dVar21 + dVar23 * dVar23)
                - (lcon - dVar30) * (lcon - dVar30)) / (dVar4 * (dVar3 + dVar3) * lcd));
  dVar3 = local_378.z;
  dVar10 = local_378.y;
  dVar9 = local_378.x;
  dVar29 = local_398.z;
  dVar6 = local_398.y;
  dVar27 = local_398.x;
  dVar21 = sin(theta);
  dVar23 = cos(dVar22);
  dVar28 = Point::dis(&local_398,&local_378);
  dVar8 = local_398.z;
  dVar7 = local_398.y;
  dVar5 = local_398.x;
  dVar28 = (dVar21 * lcd * dVar23) / dVar28;
  dVar30 = (dVar29 - dVar3) * dVar28 + local_378.z;
  dVar29 = (c->super_Point).y - (b->super_Point).y;
  dVar24 = (c->super_Point).z;
  dVar31 = (b->super_Point).z;
  local_348 = local_378.x;
  dStack_340 = local_378.y;
  local_358 = local_378.y;
  dStack_350 = local_378.z;
  dVar21 = (c->super_Point).x;
  dVar23 = (b->super_Point).x;
  dVar3 = sin(theta);
  dVar4 = sin(dVar22);
  dVar25 = Point::dis(&local_398,&local_378);
  dVar26 = Point::dis(&c->super_Point,&b->super_Point);
  dVar24 = dVar24 - dVar31;
  dVar21 = dVar21 - dVar23;
  dVar23 = (dVar3 * lcd * dVar4) / (dVar25 * dVar26);
  local_338.z = dVar30 + ((dVar5 - local_348) * dVar29 - dVar21 * (dVar7 - local_358)) * dVar23;
  local_338.x = dVar23 * ((dVar7 - local_358) * dVar24 - dVar29 * (dVar8 - dStack_350)) +
                dVar28 * (dVar27 - dVar9) + local_348;
  local_338.y = dVar23 * ((dVar8 - dStack_350) * dVar21 - dVar24 * (dVar5 - local_348)) +
                dVar28 * (dVar6 - dVar10) + dStack_340;
  Atom::operator=(&p1,&local_338);
  dVar3 = local_378.z;
  dVar8 = local_378.y;
  dVar6 = local_378.x;
  dVar29 = local_398.z;
  dVar24 = local_398.y;
  dVar30 = local_398.x;
  dVar21 = sin(theta);
  dVar23 = cos(dVar22);
  dVar28 = Point::dis(&local_398,&local_378);
  dVar10 = local_378.z;
  dVar9 = local_378.y;
  dVar7 = local_378.x;
  dVar5 = local_398.z;
  dVar27 = local_398.y;
  dVar31 = local_398.x;
  dVar28 = (dVar21 * lcd * dVar23) / dVar28;
  dVar25 = (dVar29 - dVar3) * dVar28 + local_378.z;
  dVar23 = (c->super_Point).y - (b->super_Point).y;
  local_448 = (c->super_Point).z;
  dVar26 = (b->super_Point).z;
  dVar21 = (c->super_Point).x;
  uStack_440._0_4_ = SUB84(dVar21,0);
  uStack_440._4_4_ = (int)((ulong)dVar21 >> 0x20);
  dVar21 = (b->super_Point).x;
  dVar29 = sin(theta);
  dVar22 = sin(dVar22);
  dVar3 = Point::dis(&local_398,&local_378);
  dVar4 = Point::dis(&c->super_Point,&b->super_Point);
  dVar31 = dVar31 - dVar7;
  dVar27 = dVar27 - dVar9;
  local_448 = local_448 - dVar26;
  uStack_440 = uStack_440 - dVar21;
  dVar21 = (dVar29 * lcd * dVar22) / (dVar3 * dVar4);
  local_338.z = dVar25 - (dVar31 * dVar23 - uStack_440 * dVar27) * dVar21;
  local_338.x = (dVar28 * (dVar30 - dVar6) + dVar7) -
                dVar21 * (dVar27 * local_448 - dVar23 * (dVar5 - dVar10));
  local_338.y = (dVar28 * (dVar24 - dVar8) + dVar9) -
                dVar21 * ((dVar5 - dVar10) * uStack_440 - local_448 * dVar31);
  Atom::operator=(&p2,&local_338);
  iVar15 = rand();
  uVar19 = 0;
  uVar20 = 0x3fe00000;
  if (label == 0) {
    if (rem < 5) {
      uVar19 = 0xa3d70a4;
      uVar20 = 0x3fe0a3d7;
    }
    else {
      uVar19 = (undefined4)*(undefined8 *)(&DAT_0014c300 + (ulong)((uint)rem < 9) * 8);
      uVar20 = (undefined4)
               ((ulong)*(undefined8 *)(&DAT_0014c300 + (ulong)((uint)rem < 9) * 8) >> 0x20);
    }
  }
  A = &p1;
  if ((double)CONCAT44(uVar20,uVar19) < ((double)iVar15 + 0.5) / 2147483647.0) {
    A = &p2;
  }
  Atom::operator=(local_360,A);
  std::__cxx11::string::~string((string *)&p2._name);
  std::__cxx11::string::~string((string *)&p1._name);
  return;
}

Assistant:

void SMC::sample_distance(const Atom &b, const Atom &c, const Atom &B,
                          const double theta, const double lcd,
                          Atom &p, const double lcon,
                          const int label, const int rem) {
    // Find minimal, maximal distances of point B to bond angle circle
    double lbc = b.dis(c);
    Point e = c - (c - b) * (lcd * cos(theta) / lbc);
    Point Bp = B - (c - b) * ((B - e).dot(c - b) / (c - b).square());
    Point mm = e + (Bp - e) * (lcd * sin(theta) / Bp.dis(e));
    Point mp = e - (Bp - e) * (lcd * sin(theta) / Bp.dis(e));
    double md[2];
    int length = rem;

    md[0] = lcon - mp.dis(B);
    md[1] = lcon - mm.dis(B);
    Atom p1, p2;

    double x = lcon - minDistcon[label][length];
    double distby = DistconBy[label][length];
    double delby = DistdelBy[label][length];
    double mindeld = minDistdel[label][length];

    int conlower = int(x / distby + 0.00001);
    double x1 = conlower * distby;
    double x2 = x1 + distby;
    double d, y, lowgap, highgap = 0;

    int min_intY = int((md[0] - mindeld) * (1 / delby));    // integer lower bound of delta d
    int max_intY = int((md[1] - mindeld) * (1 / delby)) + 1;    // integer upper bound of delta d


    double denominator = distby * delby;
    double cdf[32];
    double pdf[32];

    if (md[0] - mindeld <= 0) {
        min_intY = 0;
        pdf[min_intY] =
                ((x2 - x) * etedCon[label][length][conlower][0] + (x - x1) * etedCon[label][length][conlower + 1][0]) *
                (1 / distby);
        lowgap = 0;
    }
    else {
        pdf[min_intY] =
                (etedCon[label][length][conlower][min_intY] * (x2 - x) * (delby * (min_intY + 1) - md[0] + mindeld) +
                 etedCon[label][length][conlower + 1][min_intY] * (x - x1) *
                 (delby * (min_intY + 1) - md[0] + mindeld) +
                 etedCon[label][length][conlower][min_intY + 1] * (x2 - x) * (md[0] - mindeld - delby * min_intY) +
                 etedCon[label][length][conlower + 1][min_intY + 1] * (x - x1) * (md[0] - mindeld - delby * min_intY)) /
                denominator;
        lowgap = delby - (md[0] - mindeld - delby * min_intY);
    }

    if (max_intY > 31) {
        max_intY = 31;
        pdf[max_intY] = ((x2 - x) * etedCon[label][length][conlower][31] +
                         (x - x1) * etedCon[label][length][conlower + 1][31]) * (1 / distby);
        highgap = 0;
    }
    else {
        pdf[max_intY] =
                (etedCon[label][length][conlower][max_intY - 1] * (x2 - x) * (delby * max_intY - md[1] + mindeld) +
                 etedCon[label][length][conlower + 1][max_intY - 1] * (x - x1) * (delby * max_intY - md[1] + mindeld) +
                 etedCon[label][length][conlower][max_intY] * (x2 - x) * (md[1] - mindeld - delby * (max_intY - 1)) +
                 etedCon[label][length][conlower + 1][max_intY] * (x - x1) *
                 (md[1] - mindeld - delby * (max_intY - 1))) / denominator;

        highgap = delby - (mindeld + delby * max_intY - md[1]);
    }


    int floor = min_intY + 1;
    pdf[floor] = ((x2 - x) * etedCon[label][length][conlower][floor] +
                  (x - x1) * etedCon[label][length][conlower + 1][floor]) * (1 / distby);
    cdf[min_intY] = 0;

    cdf[floor] = (pdf[floor] + pdf[min_intY]) * 0.5 * lowgap;


    for (int i = floor + 1; i < max_intY; i++) {
        pdf[i] = ((x2 - x) * etedCon[label][length][conlower][i] + (x - x1) * etedCon[label][length][conlower + 1][i]) *
                 (1 / distby);
        cdf[i] = cdf[i - 1] + (pdf[i] + pdf[i - 1]) * 0.5 * delby;
    }

    cdf[max_intY] = cdf[max_intY - 1] + (pdf[max_intY] + pdf[max_intY - 1]) * 0.5 * highgap;


    double randr = frand(0, cdf[max_intY]);

    double c1, c2 = 0;
    if (randr <= cdf[floor]) {
        c1 = randr;
        c2 = cdf[floor];
        y = md[0] + c1 * lowgap / c2;
    }
    else {
        for (int i = floor + 1; i < max_intY; i++) {
            if (randr <= cdf[i]) {
                c1 = randr - cdf[i - 1];
                c2 = cdf[i] - cdf[i - 1];
                y = mindeld + delby * i - delby + c1 * delby / c2;
                break;
            }
        }
        if (randr <= cdf[max_intY] && randr >= cdf[max_intY - 1]) {
            c1 = randr - cdf[max_intY - 1];
            c2 = cdf[max_intY] - cdf[max_intY - 1];
            y = mindeld + delby * (max_intY - 1) + c1 * highgap / c2;
        }
    }
    d = lcon - y;

    // Find points on bond angle circle corresponding to distances
    double gamma = acos(((B - e).square() + lcd * lcd * sin(theta) * sin(theta) - d * d) /
                        (2 * Bp.dis(e) * lcd * sin(theta)));
    p1 = e + (Bp - e) * (lcd * sin(theta) * cos(gamma) / Bp.dis(e)) +
         ((Bp - e).cross(c - b)) *
         (lcd * sin(theta) * sin(gamma) / (Bp.dis(e) * c.dis(b)));
    p2 = e + (Bp - e) * (lcd * sin(theta) * cos(gamma) / Bp.dis(e)) -
         ((Bp - e).cross(c - b)) *
         (lcd * sin(theta) * sin(gamma) / (Bp.dis(e) * c.dis(b)));

    double frand_chose = frand(0, 1);
    double threshold = 0.5;
    if (label == 0) {
        if (rem <= 4)
            threshold = 0.52;
        else if (rem > 4 && rem <= 8)
            threshold = 0.51;
        else
            threshold = 0.5;
    }
    if (frand_chose <= threshold)
        p = p1;
    else
        p = p2;
}